

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  Rep *pRVar5;
  MethodDescriptorProto *pMVar6;
  ServiceOptions *this_00;
  undefined8 *puVar7;
  long lVar8;
  ServiceOptions *from;
  Arena *arena;
  long lVar9;
  
  uVar2 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar3 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar7 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar2,puVar7);
  if (0 < *(int *)(this + 0x28)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      lVar4 = *(long *)(this + 0x20);
      pRVar5 = (proto->method_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_00349025:
        pMVar6 = Arena::CreateMaybeMessage<google::protobuf::MethodDescriptorProto>
                           ((proto->method_).super_RepeatedPtrFieldBase.arena_);
        pMVar6 = (MethodDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(proto->method_).super_RepeatedPtrFieldBase,pMVar6);
      }
      else {
        iVar1 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar1) goto LAB_00349025;
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pMVar6 = (MethodDescriptorProto *)pRVar5->elements[iVar1];
      }
      MethodDescriptor::CopyTo((MethodDescriptor *)(lVar4 + lVar9),pMVar6);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x40;
    } while (lVar8 < *(int *)(this + 0x28));
  }
  from = *(ServiceOptions **)(this + 0x18);
  if (from != (ServiceOptions *)_ServiceOptions_default_instance_) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    this_00 = proto->options_;
    if (this_00 == (ServiceOptions *)0x0) {
      uVar3 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(arena);
      proto->options_ = this_00;
      from = *(ServiceOptions **)(this + 0x18);
    }
    ServiceOptions::CopyFrom(this_00,from);
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}